

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIFileOpenDialog::pathToStringW(CGUIFileOpenDialog *this,stringw *result,path *p)

{
  core::multibyteToWString(result,p);
  return;
}

Assistant:

void CGUIFileOpenDialog::pathToStringW(irr::core::stringw &result, const irr::io::path &p)
{
	core::multibyteToWString(result, p);
}